

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomicops_internals_x86_gcc.h
# Opt level: O0

Atomic64 google::protobuf::internal::NoBarrier_AtomicIncrement(Atomic64 *ptr,Atomic64 increment)

{
  long lVar1;
  Atomic64 temp;
  Atomic64 increment_local;
  Atomic64 *ptr_local;
  
  LOCK();
  lVar1 = *ptr;
  *ptr = *ptr + increment;
  UNLOCK();
  return lVar1 + increment;
}

Assistant:

inline Atomic64 NoBarrier_AtomicIncrement(volatile Atomic64* ptr,
                                          Atomic64 increment) {
  Atomic64 temp = increment;
  __asm__ __volatile__("lock; xaddq %0,%1"
                       : "+r" (temp), "+m" (*ptr)
                       : : "memory");
  // temp now contains the previous value of *ptr
  return temp + increment;
}